

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

StructUnionTypeSyntax * __thiscall
slang::parsing::Parser::parseStructUnion(Parser *this,SyntaxKind syntaxKind)

{
  Token semi_00;
  Token packed_00;
  Token signing_00;
  Token openBrace_00;
  Token closeBrace_00;
  span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> elements;
  Token tagged_00;
  Token keyword_00;
  Token randomQualifier_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  Token TVar1;
  Token TVar2;
  bool bVar3;
  int iVar4;
  DataTypeSyntax *type_00;
  SourceLocation SVar5;
  reference ppVVar6;
  undefined4 extraout_var;
  StructUnionTypeSyntax *pSVar7;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  size_type extraout_RDX_04;
  optional<slang::DiagCode> diagCode;
  Token TVar8;
  Token TVar9;
  AttrList AVar10;
  SourceRange SVar11;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar12;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> sVar13;
  bool local_509;
  undefined8 local_458;
  SyntaxList<slang::syntax::VariableDimensionSyntax> local_428;
  char local_3f8 [8];
  Info *pIStack_3f0;
  pointer local_3e8;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> local_3d8;
  Info *local_3a8;
  Info *pIStack_3a0;
  Info *local_398;
  Info *pIStack_390;
  Info *local_388;
  Info *pIStack_380;
  Info *local_378;
  Info *pIStack_370;
  Info *local_368;
  Info *pIStack_360;
  SourceRange local_358;
  DiagCode local_344;
  SourceRange local_340;
  DiagCode local_32c;
  SourceLocation local_328;
  SourceLocation SStack_320;
  undefined4 local_30c;
  Token local_308;
  SourceRange local_2f8;
  SourceLocation local_2e8;
  Token local_2e0;
  SourceLocation local_2d0;
  undefined1 auStack_2c8 [8];
  SourceRange range;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> dims;
  _Storage<slang::DiagCode,_true> local_26e;
  undefined2 local_26a;
  SourceLocation local_268;
  Token local_260;
  SourceLocation local_250;
  size_type local_248;
  pointer local_238;
  pointer pTStack_230;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> local_228;
  Token local_1f8;
  pointer local_1e8;
  pointer ppAStack_1e0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_1d8;
  StructUnionMemberSyntax *local_1a8;
  undefined1 auStack_1a0 [8];
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> declarators;
  Token semi;
  DataTypeSyntax *type;
  SourceLocation SStack_168;
  bitmask<slang::parsing::detail::TypeOptions> typeOptions;
  undefined1 auStack_118 [8];
  Token randomQualifier;
  AttrList attributes;
  Token curr;
  undefined1 local_b8 [8];
  SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL> buffer;
  Token closeBrace;
  Token openBrace;
  Token signing;
  Token packed;
  Token tagged;
  Token keyword;
  SyntaxKind syntaxKind_local;
  Parser *this_local;
  
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  join_0x00000010_0x00000000_ = ParserBase::consumeIf(&this->super_ParserBase,TaggedKeyword);
  join_0x00000010_0x00000000_ = ParserBase::consumeIf(&this->super_ParserBase,PackedKeyword);
  join_0x00000010_0x00000000_ = parseSigning(this);
  join_0x00000010_0x00000000_ = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  Token::Token((Token *)(buffer.stackBase + 0x18));
  SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL> *)local_b8);
  bVar3 = Token::isMissing((Token *)&closeBrace.info);
  tagged.info._0_2_ = TVar8.kind;
  if (bVar3) {
    SVar5 = Token::location((Token *)&closeBrace.info);
    TVar9 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar5);
    buffer.stackBase._24_8_ = TVar9._0_8_;
  }
  else {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    attributes.size_ = TVar9._0_8_;
    while ((short)attributes.size_ != 0xe && (short)attributes.size_ != 1) {
      AVar10 = parseAttributes(this);
      attributes.data_ = (pointer)AVar10.size_;
      Token::Token((Token *)auStack_118);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      if (TVar9.kind == RandKeyword || TVar9.kind == RandCKeyword) {
        TVar9 = ParserBase::consume(&this->super_ParserBase);
        randomQualifier._0_8_ = TVar9.info;
        auStack_118 = TVar9._0_8_;
        bVar3 = Token::operator_cast_to_bool((Token *)&signing.info);
        if (bVar3) {
          SVar11 = Token::range((Token *)auStack_118);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x810005,SVar11);
        }
        else if ((TokenKind)tagged.info == UnionKeyword) {
          SVar11 = Token::range((Token *)auStack_118);
          SStack_168 = SVar11.startLoc;
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x820005,SVar11);
        }
      }
      bitmask<slang::parsing::detail::TypeOptions>::bitmask
                ((bitmask<slang::parsing::detail::TypeOptions> *)((long)&type + 4));
      bVar3 = Token::valid((Token *)&packed.info);
      if ((bVar3) && ((TokenKind)tagged.info == UnionKeyword)) {
        bitmask<slang::parsing::detail::TypeOptions>::bitmask
                  ((bitmask<slang::parsing::detail::TypeOptions> *)&type,AllowVoid);
        type._4_4_ = (underlying_type)type;
      }
      type_00 = parseDataType(this,type._4_4_);
      Token::Token((Token *)&declarators.size_);
      sVar12 = parseDeclarators(this,(Token *)&declarators.size_,false,false);
      declarators.data_ = (pointer)sVar12.size_;
      auStack_1a0 = (undefined1  [8])sVar12.data_;
      ppAStack_1e0 = attributes.data_;
      elements_00.size_ = (size_type)attributes.data_;
      elements_00.data_ = AVar10.data_;
      local_1e8 = AVar10.data_;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                (&local_1d8,elements_00);
      local_1f8.kind = auStack_118._0_2_;
      local_1f8._2_1_ = auStack_118[2];
      local_1f8.numFlags.raw = auStack_118[3];
      local_1f8.rawLen = auStack_118._4_4_;
      local_1f8.info = (Info *)randomQualifier._0_8_;
      local_238 = (pointer)auStack_1a0;
      pTStack_230 = declarators.data_;
      sVar12.size_ = (size_type)declarators.data_;
      sVar12.data_ = (pointer)auStack_1a0;
      slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
                (&local_228,sVar12);
      local_248 = declarators.size_;
      randomQualifier_00.info = local_1f8.info;
      randomQualifier_00.kind = local_1f8.kind;
      randomQualifier_00._2_1_ = local_1f8._2_1_;
      randomQualifier_00.numFlags.raw = local_1f8.numFlags.raw;
      randomQualifier_00.rawLen = local_1f8.rawLen;
      semi_00.info = (Info *)semi._0_8_;
      semi_00.kind = (undefined2)declarators.size_;
      semi_00._2_1_ = declarators.size_._2_1_;
      semi_00.numFlags.raw = declarators.size_._3_1_;
      semi_00.rawLen = declarators.size_._4_4_;
      local_1a8 = slang::syntax::SyntaxFactory::structUnionMember
                            (&this->factory,&local_1d8,randomQualifier_00,type_00,&local_228,semi_00
                            );
      SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::push_back
                ((SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*> *)local_b8,&local_1a8);
      local_509 = false;
      if ((type_00->super_ExpressionSyntax).super_SyntaxNode.kind == ImplicitType) {
        bVar3 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::empty
                          ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)auStack_1a0
                          );
        local_509 = false;
        if (bVar3) {
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          local_260 = TVar9;
          local_250 = Token::location(&local_260);
          local_268 = Token::location((Token *)&attributes.size_);
          local_509 = SourceLocation::operator==(&local_250,&local_268);
        }
      }
      if (local_509 != false) {
        std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_26e._M_value);
        diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
        super__Optional_payload_base<slang::DiagCode>._4_2_ = local_26a;
        diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
        super__Optional_payload_base<slang::DiagCode>._M_payload = local_26e;
        ParserBase::skipToken(&this->super_ParserBase,diagCode);
      }
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      attributes.size_ = TVar9._0_8_;
    }
    TVar9 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    closeBrace._0_8_ = TVar9.info;
    buffer.stackBase._24_8_ = TVar9._0_8_;
    bVar3 = SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::empty
                      ((SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*> *)local_b8);
    if (bVar3) {
      bVar3 = Token::isMissing((Token *)(buffer.stackBase + 0x18));
      if (!bVar3) {
        SVar5 = Token::location((Token *)(buffer.stackBase + 0x18));
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x350005,SVar5);
      }
    }
    TVar9.info = (Info *)closeBrace._0_8_;
    TVar9._0_8_ = local_458;
  }
  closeBrace._0_8_ = TVar9.info;
  sVar13 = parseDimensionList(this);
  range.endLoc = (SourceLocation)sVar13.data_;
  bVar3 = Token::operator_cast_to_bool((Token *)&signing.info);
  TVar2.info = local_2e0.info;
  TVar2.kind = local_2e0.kind;
  TVar2._2_1_ = local_2e0._2_1_;
  TVar2.numFlags.raw = local_2e0.numFlags.raw;
  TVar2.rawLen = local_2e0.rawLen;
  TVar1.info = local_308.info;
  TVar1.kind = local_308.kind;
  TVar1._2_1_ = local_308._2_1_;
  TVar1.numFlags.raw = local_308.numFlags.raw;
  TVar1.rawLen = local_308.rawLen;
  src = extraout_RDX;
  if (!bVar3) {
    bVar3 = nonstd::span_lite::
            span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                       &range.endLoc);
    if (!bVar3) {
      ppVVar6 = nonstd::span_lite::
                span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::front
                          ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *
                           )&range.endLoc);
      local_2e0 = slang::syntax::SyntaxNode::getFirstToken(&(*ppVVar6)->super_SyntaxNode);
      local_2d0 = Token::location(&local_2e0);
      ppVVar6 = nonstd::span_lite::
                span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::back
                          ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *
                           )&range.endLoc);
      local_308 = slang::syntax::SyntaxNode::getLastToken(&(*ppVVar6)->super_SyntaxNode);
      local_2f8 = Token::range(&local_308);
      local_2e8 = SourceRange::end(&local_2f8);
      SourceRange::SourceRange((SourceRange *)auStack_2c8,local_2d0,local_2e8);
      local_30c = 0x780005;
      local_328 = (SourceLocation)auStack_2c8;
      SStack_320 = range.startLoc;
      SVar11.endLoc = range.startLoc;
      SVar11.startLoc = (SourceLocation)auStack_2c8;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x780005,SVar11);
    }
    bVar3 = Token::operator_cast_to_bool((Token *)&openBrace.info);
    src = extraout_RDX_00;
    TVar1 = local_308;
    TVar2 = local_2e0;
    if (bVar3) {
      local_32c.subsystem = Parser;
      local_32c.code = 0x8d;
      local_340 = Token::range((Token *)&openBrace.info);
      ParserBase::addDiag(&this->super_ParserBase,local_32c,local_340);
      src = extraout_RDX_01;
      TVar1 = local_308;
      TVar2 = local_2e0;
    }
  }
  local_308 = TVar1;
  local_2e0 = TVar2;
  if ((TokenKind)tagged.info == StructKeyword) {
    bVar3 = Token::valid((Token *)&packed.info);
    src = extraout_RDX_02;
    if (bVar3) {
      local_344.subsystem = Parser;
      local_344.code = 0x87;
      local_358 = Token::range((Token *)&packed.info);
      ParserBase::addDiag(&this->super_ParserBase,local_344,local_358);
      src = extraout_RDX_03;
    }
  }
  tagged.info = TVar8._0_8_;
  keyword._0_8_ = TVar8.info;
  local_368 = tagged.info;
  pIStack_360 = (Info *)keyword._0_8_;
  local_378 = packed.info;
  pIStack_370 = (Info *)tagged._0_8_;
  local_388 = signing.info;
  pIStack_380 = (Info *)packed._0_8_;
  local_398 = openBrace.info;
  pIStack_390 = (Info *)signing._0_8_;
  local_3a8 = closeBrace.info;
  pIStack_3a0 = (Info *)openBrace._0_8_;
  iVar4 = SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*> *)local_b8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_3e8 = (pointer)CONCAT44(extraout_var,iVar4);
  elements.size_ = extraout_RDX_04;
  elements.data_ = local_3e8;
  slang::syntax::SyntaxList<slang::syntax::StructUnionMemberSyntax>::SyntaxList(&local_3d8,elements)
  ;
  local_3f8[0] = buffer.stackBase[0x18];
  local_3f8[1] = buffer.stackBase[0x19];
  local_3f8[2] = buffer.stackBase[0x1a];
  local_3f8[3] = buffer.stackBase[0x1b];
  local_3f8[4] = buffer.stackBase[0x1c];
  local_3f8[5] = buffer.stackBase[0x1d];
  local_3f8[6] = buffer.stackBase[0x1e];
  local_3f8[7] = buffer.stackBase[0x1f];
  pIStack_3f0 = (Info *)closeBrace._0_8_;
  sVar13.size_ = sVar13.size_;
  sVar13.data_ = (pointer)range.endLoc;
  slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList(&local_428,sVar13);
  keyword_00.info = pIStack_360;
  keyword_00._0_8_ = local_368;
  tagged_00.info = pIStack_370;
  tagged_00._0_8_ = local_378;
  packed_00.info = pIStack_380;
  packed_00._0_8_ = local_388;
  signing_00.info = pIStack_390;
  signing_00._0_8_ = local_398;
  openBrace_00.info = pIStack_3a0;
  openBrace_00._0_8_ = local_3a8;
  closeBrace_00.info = pIStack_3f0;
  closeBrace_00._0_8_ = local_3f8;
  pSVar7 = slang::syntax::SyntaxFactory::structUnionType
                     (&this->factory,syntaxKind,keyword_00,tagged_00,packed_00,signing_00,
                      openBrace_00,&local_3d8,closeBrace_00,&local_428);
  SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL> *)local_b8);
  return pSVar7;
}

Assistant:

StructUnionTypeSyntax& Parser::parseStructUnion(SyntaxKind syntaxKind) {
    auto keyword = consume();
    auto tagged = consumeIf(TokenKind::TaggedKeyword);
    auto packed = consumeIf(TokenKind::PackedKeyword);
    auto signing = parseSigning();
    auto openBrace = expect(TokenKind::OpenBrace);

    Token closeBrace;
    SmallVector<StructUnionMemberSyntax*> buffer;

    if (openBrace.isMissing())
        closeBrace = missingToken(TokenKind::CloseBrace, openBrace.location());
    else {
        auto curr = peek();
        while (curr.kind != TokenKind::CloseBrace && curr.kind != TokenKind::EndOfFile) {
            auto attributes = parseAttributes();

            Token randomQualifier;
            switch (peek().kind) {
                case TokenKind::RandKeyword:
                case TokenKind::RandCKeyword:
                    randomQualifier = consume();
                    if (packed)
                        addDiag(diag::RandOnPackedMember, randomQualifier.range());
                    else if (keyword.kind == TokenKind::UnionKeyword)
                        addDiag(diag::RandOnUnionMember, randomQualifier.range());
                    break;
                default:
                    break;
            }

            bitmask<TypeOptions> typeOptions;
            if (tagged.valid() && keyword.kind == TokenKind::UnionKeyword)
                typeOptions = TypeOptions::AllowVoid;

            auto& type = parseDataType(typeOptions);

            Token semi;
            auto declarators = parseDeclarators(semi);

            buffer.push_back(
                &factory.structUnionMember(attributes, randomQualifier, type, declarators, semi));

            // If we failed to consume any tokens for this member, skip whatever token is
            // in the way, otherwise we will loop forever.
            if (type.kind == SyntaxKind::ImplicitType && declarators.empty() &&
                peek().location() == curr.location()) {
                skipToken({});
            }

            curr = peek();
        }
        closeBrace = expect(TokenKind::CloseBrace);

        if (buffer.empty() && !closeBrace.isMissing())
            addDiag(diag::ExpectedMember, closeBrace.location());
    }

    auto dims = parseDimensionList();
    if (!packed) {
        if (!dims.empty()) {
            SourceRange range{dims.front()->getFirstToken().location(),
                              dims.back()->getLastToken().range().end()};
            addDiag(diag::PackedDimsOnUnpacked, range);
        }

        if (signing)
            addDiag(diag::UnpackedSigned, signing.range());
    }

    if (keyword.kind == TokenKind::StructKeyword && tagged.valid())
        addDiag(diag::TaggedStruct, tagged.range());

    return factory.structUnionType(syntaxKind, keyword, tagged, packed, signing, openBrace,
                                   buffer.copy(alloc), closeBrace, dims);
}